

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdumpPrepass::OnGlobalSymbol
          (BinaryReaderObjdumpPrepass *this,Index index,uint32_t flags,string_view name,
          Index global_index)

{
  pointer pOVar1;
  long *local_58 [2];
  long local_48 [2];
  Index local_38;
  
  if (name._M_len != 0) {
    ObjdumpNames::Set(&((this->super_BinaryReaderObjdumpBase).objdump_state_)->global_names,
                      global_index,name);
  }
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,name._M_str,name._M_str + name._M_len);
  pOVar1 = (((this->super_BinaryReaderObjdumpBase).objdump_state_)->symtab).
           super__Vector_base<wabt::ObjdumpSymbol,_std::allocator<wabt::ObjdumpSymbol>_>._M_impl.
           super__Vector_impl_data._M_start + index;
  pOVar1->kind = Global;
  local_38 = global_index;
  std::__cxx11::string::operator=((string *)&pOVar1->name,(string *)local_58);
  pOVar1->index = local_38;
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  return (Result)Ok;
}

Assistant:

Result OnGlobalSymbol(Index index,
                        uint32_t flags,
                        std::string_view name,
                        Index global_index) override {
    if (!name.empty()) {
      SetGlobalName(global_index, name);
    }
    objdump_state_->symtab[index] = {SymbolType::Global, std::string(name),
                                     global_index};
    return Result::Ok;
  }